

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_TranslucentLine(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                      int arg4)

{
  byte *pbVar1;
  line_t *plVar2;
  uint uVar3;
  int iVar4;
  FLineIdIterator local_30;
  
  local_30.start = tagManager.IDHashFirst[(ulong)(uint)arg0 & 0xff];
  local_30.searchtag = arg0;
  uVar3 = FLineIdIterator::Next(&local_30);
  if (-1 < (int)uVar3) {
    iVar4 = 0xff;
    if (arg1 < 0xff) {
      iVar4 = arg1;
    }
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    do {
      plVar2 = lines;
      lines[uVar3].alpha = (double)iVar4 / 255.0;
      if (arg2 == 1) {
        pbVar1 = (byte *)((long)&plVar2[uVar3].flags + 1);
        *pbVar1 = *pbVar1 | 4;
      }
      else if (arg2 == 0) {
        pbVar1 = (byte *)((long)&plVar2[uVar3].flags + 1);
        *pbVar1 = *pbVar1 & 0xfb;
      }
      else {
        Printf("Unknown translucency type used with TranslucentLine\n");
      }
      uVar3 = FLineIdIterator::Next(&local_30);
    } while (-1 < (int)uVar3);
  }
  return 1;
}

Assistant:

FUNC(LS_TranslucentLine)
// TranslucentLine (id, amount, type)
{
	FLineIdIterator itr(arg0);
	int linenum;
	while ((linenum = itr.Next()) >= 0)
	{
		lines[linenum].alpha = clamp(arg1, 0, 255) / 255.;
		if (arg2 == 0)
		{
			lines[linenum].flags &= ~ML_ADDTRANS;
		}
		else if (arg2 == 1)
		{
			lines[linenum].flags |= ML_ADDTRANS;
		}
		else
		{
			Printf ("Unknown translucency type used with TranslucentLine\n");
		}
	}

	return true;
}